

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O0

void __thiscall helics::tcp::TcpCommsSS::queue_tx_function(TcpCommsSS *this)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  milliseconds timeOut;
  bool bVar1;
  __int_type_conflict _Var2;
  uint uVar3;
  int32_t iVar4;
  ConnectionStatus CVar5;
  undefined4 *puVar6;
  mapped_type *pmVar7;
  pointer ppVar8;
  element_type *peVar9;
  element_type *peVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__n;
  _Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  __n_00;
  char *pcVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  int iVar12;
  _Self *__y_02;
  int *__rep;
  _Rb_tree_node_base *in_RDI;
  undefined1 *in_R8;
  string_view sVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_bool>
  pVar14;
  pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_> *rt_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  *__range2_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>
  *rt;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  *__range2;
  system_error *se_2;
  system_error *se_1;
  iterator rt_find;
  system_error *se;
  exception *e_2;
  pointer new_connect_1;
  iterator efind;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>
  *mc;
  iterator __end6;
  iterator __begin6;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  *__range6;
  bool established;
  pointer conn_1;
  bool processed;
  ActionMessage cmd;
  route_id rid;
  bool haltLoop;
  exception *e_1;
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  routes;
  pointer brokerConnection;
  vector<char,_std::allocator<char>_> buffer;
  exception *e;
  pointer new_connect;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *conn;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  established_routes;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  made_connections;
  string cstring;
  ActionMessage cmessage;
  bool connected;
  anon_class_8_1_3fcf6524 errorCall;
  CommsInterface *ci;
  anon_class_8_1_8991fb9c dataCall;
  LoopHandle contextLoop;
  SocketFactory sf;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  pointer server;
  memory_order __b;
  undefined4 in_stack_ffffffffffffedf8;
  undefined4 in_stack_ffffffffffffedfc;
  undefined4 in_stack_ffffffffffffee00;
  __int_type_conflict in_stack_ffffffffffffee04;
  undefined4 in_stack_ffffffffffffee08;
  ConnectionStatus in_stack_ffffffffffffee0c;
  CommsInterface *in_stack_ffffffffffffee10;
  undefined4 in_stack_ffffffffffffee18;
  action_t in_stack_ffffffffffffee1c;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  *dataFunc;
  TcpConnection *in_stack_ffffffffffffee20;
  ActionMessage *in_stack_ffffffffffffee28;
  undefined4 in_stack_ffffffffffffee30;
  int in_stack_ffffffffffffee34;
  element_type *in_stack_ffffffffffffee38;
  undefined5 in_stack_ffffffffffffee40;
  undefined1 in_stack_ffffffffffffee45;
  uint16_t in_stack_ffffffffffffee46;
  undefined4 in_stack_ffffffffffffee48;
  int in_stack_ffffffffffffee4c;
  undefined7 in_stack_ffffffffffffee50;
  undefined1 in_stack_ffffffffffffee57;
  string *in_stack_ffffffffffffee58;
  SocketFactory *in_stack_ffffffffffffee60;
  CommsInterface *in_stack_ffffffffffffee70;
  TcpServer *in_stack_ffffffffffffee78;
  TcpConnection *in_stack_ffffffffffffee80;
  string *in_stack_ffffffffffffee88;
  string *in_stack_ffffffffffffeed0;
  io_context *in_stack_ffffffffffffeed8;
  SocketFactory *in_stack_ffffffffffffeee0;
  milliseconds in_stack_ffffffffffffeee8;
  NetworkCommsInterface *in_stack_ffffffffffffeef8;
  TcpServer *in_stack_ffffffffffffef48;
  milliseconds in_stack_ffffffffffffef50;
  undefined4 in_stack_ffffffffffffef88;
  undefined4 in_stack_ffffffffffffef8c;
  string *in_stack_ffffffffffffef90;
  undefined7 in_stack_ffffffffffffef98;
  undefined1 in_stack_ffffffffffffef9f;
  SocketFactory *in_stack_ffffffffffffefa0;
  undefined4 in_stack_ffffffffffffefa8;
  undefined4 in_stack_ffffffffffffefac;
  undefined7 in_stack_ffffffffffffefe8;
  undefined1 in_stack_ffffffffffffefef;
  bool local_fc1;
  element_type *in_stack_fffffffffffff0c0;
  int local_eb4;
  duration<long,std::ratio<1l,1000l>> local_eb0 [8];
  undefined1 local_ea8 [24];
  undefined1 local_e90 [32];
  undefined8 local_e70;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>_>
  local_e68;
  __native_type local_e60;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  local_e31 [2];
  __sv_type local_df0;
  undefined1 local_d10 [240];
  undefined1 local_c20 [32];
  _Self local_c00;
  _Self local_bf8;
  undefined1 local_be9 [257];
  undefined1 local_ae8 [56];
  route_id local_ab0;
  allocator<char> local_aa9 [9];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_aa0;
  allocator<char> local_a71 [65];
  __sv_type local_a30;
  allocator<char> local_941;
  string_view local_940;
  route_id local_90c [6];
  route_id local_8f4 [18];
  int local_8ac;
  undefined1 *local_8a8;
  allocator<char> local_899;
  string_view local_898;
  _Rb_tree_node_base local_888;
  __shared_ptr local_868 [16];
  _Rb_tree_node_base *local_858;
  undefined1 local_850;
  route_id local_844;
  _Rb_tree_node_base *local_840;
  undefined1 local_838;
  route_id local_830;
  undefined4 local_82c;
  _Self local_828;
  allocator<char> local_819;
  _Rb_tree_node_base *local_818;
  undefined8 local_810;
  _Self local_7e8;
  route_id local_7dc;
  _Base_ptr local_7d8;
  undefined1 local_7d0;
  route_id local_7c4;
  __sv_type local_7c0;
  string_view local_7b0;
  reference local_7a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>
  *local_798;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>_>
  local_790;
  undefined1 *local_788;
  byte local_779;
  _Rb_tree_node_base *local_768;
  char *local_760;
  byte local_751;
  __sv_type local_730;
  string_view local_720;
  __sv_type local_710;
  string_view local_700;
  __shared_ptr local_6f0 [16];
  undefined4 local_6e0;
  byte local_6d9;
  ActionMessage local_608;
  route_id local_550;
  byte local_549;
  int local_448;
  undefined8 local_438;
  undefined1 local_430 [48];
  undefined1 local_400 [48];
  __shared_ptr local_3d0 [268];
  int local_2c4;
  undefined1 *local_2c0;
  __shared_ptr local_2b8 [16];
  _Rb_tree_node_base *local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_298;
  _Base_ptr *local_290;
  undefined1 local_258 [24];
  undefined1 local_240 [68];
  undefined4 local_1fc;
  undefined4 local_104;
  int local_100;
  undefined8 local_f0;
  undefined1 local_e5;
  int local_e4;
  duration<long,std::ratio<1l,1000l>> local_e0 [72];
  undefined1 local_98 [88];
  __shared_ptr local_40 [44];
  undefined4 local_14;
  memory_order local_10;
  int local_c;
  undefined4 *local_8;
  
  if ((((ulong)in_RDI[0x12]._M_right & 0x1000000) != 0) &&
     (_Var2 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)
                         CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08)), _Var2 < 0))
  {
    getDefaultBrokerPort((TcpCommsSS *)0x4085ae);
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
               in_stack_ffffffffffffee04);
  }
  if ((((ulong)in_RDI[0x12]._M_right & 0x1000000) == 0) &&
     (((ulong)((_Alloc_hider *)&in_RDI[0x26]._M_color)->_M_p & 1) == 0)) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee10,
               (char *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
    sVar13._M_str = (char *)in_stack_ffffffffffffee80;
    sVar13._M_len = (size_t)in_stack_ffffffffffffee78;
    CommsInterface::logError(in_stack_ffffffffffffee70,sVar13);
    CommsInterface::setRxStatus(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c);
    CommsInterface::setTxStatus(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c);
    return;
  }
  std::shared_ptr<gmlc::networking::TcpServer>::shared_ptr
            ((shared_ptr<gmlc::networking::TcpServer> *)0x40864d);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee10);
  gmlc::networking::AsioContextManager::getContextPointer(in_stack_ffffffffffffee88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
  if (((ulong)in_RDI[0x20]._M_right & 0x100000000) == 0) {
    memset(local_98,0,0x18);
    gmlc::networking::SocketFactory::SocketFactory
              ((SocketFactory *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
  }
  else {
    gmlc::networking::SocketFactory::SocketFactory
              (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
  }
  std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4086ea);
  gmlc::networking::AsioContextManager::startContextLoop
            ((AsioContextManager *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
  __n_00._M_node = in_RDI;
  if (((ulong)in_RDI[0x12]._M_right & 0x1000000) != 0) {
    std::
    __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x40873e);
    gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x408746);
    __n_00._M_node = (_Base_ptr)&in_RDI[7]._M_left;
    puVar6 = (undefined4 *)((long)&in_RDI[0x20]._M_left + 4);
    local_c = 5;
    local_8 = puVar6;
    local_10 = std::operator&(seq_cst,__memory_order_mask);
    if (local_c - 1U < 2) {
      local_14 = *puVar6;
    }
    else if (local_c == 5) {
      local_14 = *puVar6;
    }
    else {
      local_14 = *puVar6;
    }
    in_R8 = (undefined1 *)(ulong)(ushort)local_14;
    in_stack_ffffffffffffedf8 = *(undefined4 *)&in_RDI[0x13]._M_parent;
    gmlc::networking::TcpServer::create
              ((SocketFactory *)in_stack_ffffffffffffee58,
               (io_context *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (string *)CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48),
               in_stack_ffffffffffffee46,(bool)in_stack_ffffffffffffee45,
               (int)in_stack_ffffffffffffee70);
    std::shared_ptr<gmlc::networking::TcpServer>::operator=
              ((shared_ptr<gmlc::networking::TcpServer> *)
               CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
               (shared_ptr<gmlc::networking::TcpServer> *)
               CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
    std::shared_ptr<gmlc::networking::TcpServer>::~shared_ptr
              ((shared_ptr<gmlc::networking::TcpServer> *)0x408872);
    do {
      std::
      __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x40887f);
      bVar1 = gmlc::networking::TcpServer::isReady((TcpServer *)0x408887);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::
        __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x408a66);
        std::
        function<unsigned_long(std::shared_ptr<gmlc::networking::TcpConnection>,char_const*,unsigned_long)>
        ::function<helics::tcp::TcpCommsSS::queue_tx_function()::__0&,void>
                  ((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                    *)in_stack_ffffffffffffee10,
                   (anon_class_8_1_8991fb9c *)
                   CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
        gmlc::networking::TcpServer::setDataCall
                  ((TcpServer *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                   (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                    *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
        std::
        function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
        ::~function((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                     *)0x408aaf);
        std::
        __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x408abc);
        std::function<bool(std::shared_ptr<gmlc::networking::TcpConnection>,std::error_code_const&)>
        ::function<helics::tcp::TcpCommsSS::queue_tx_function()::__1&,void>
                  ((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                    *)in_stack_ffffffffffffee10,
                   (anon_class_8_1_3fcf6524 *)
                   CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
        gmlc::networking::TcpServer::setErrorCall
                  ((TcpServer *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                   (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                    *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
        std::
        function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
        ~function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                   *)0x408b05);
        std::
        __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x408b12);
        gmlc::networking::TcpServer::start(in_stack_ffffffffffffef48);
        goto LAB_00408b6a;
      }
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee10,
                 (char *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
      message._M_str = (char *)in_stack_ffffffffffffee80;
      message._M_len = (size_t)in_stack_ffffffffffffee78;
      CommsInterface::logWarning(in_stack_ffffffffffffee70,message);
      local_e4 = 0x96;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_e0,&local_e4);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT26(in_stack_ffffffffffffee46,
                          CONCAT15(in_stack_ffffffffffffee45,in_stack_ffffffffffffee40)));
      std::
      __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x408913);
      local_f0 = *(undefined8 *)(in_RDI + 0x13);
      local_e5 = gmlc::networking::TcpServer::reConnect
                           (in_stack_ffffffffffffef48,in_stack_ffffffffffffef50);
    } while ((bool)local_e5);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee10,
               (char *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
    message_00._M_str = (char *)in_stack_ffffffffffffee80;
    message_00._M_len = (size_t)in_stack_ffffffffffffee78;
    iVar12 = local_100;
    CommsInterface::logError(in_stack_ffffffffffffee70,message_00);
    peVar10 = std::
              __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4089a1);
    gmlc::networking::TcpServer::close(peVar10,iVar12);
    CommsInterface::setRxStatus(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c);
    CommsInterface::setTxStatus(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c);
    local_104 = 1;
    goto LAB_0040bc42;
  }
LAB_00408b6a:
  ActionMessage::ActionMessage((ActionMessage *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee1c)
  ;
  local_1fc = 299;
  NetworkCommsInterface::getAddress_abi_cxx11_(in_stack_ffffffffffffeef8);
  SmallBuffer::operator=
            ((SmallBuffer *)in_stack_ffffffffffffee28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
  ActionMessage::packetize_abi_cxx11_(in_stack_ffffffffffffee28);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
            *)0x408be8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
         *)0x408bf5);
  if (((ulong)((_Alloc_hider *)&in_RDI[0x26]._M_color)->_M_p & 1) != 0) {
    local_290 = &in_RDI[0x27]._M_parent;
    local_298._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
    local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_2a8 = (_Rb_tree_node_base *)
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_298);
      std::
      __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x408c8c);
      gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x408c94);
      __n_00._M_node = local_2a8;
      local_2c4 = 0;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_2c0,&local_2c4);
      in_R8 = local_2c0;
      gmlc::networking::establishConnection
                (in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                 in_stack_ffffffffffffeee8);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
      if (bVar1) {
        in_stack_fffffffffffff0c0 =
             std::
             __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x408d22);
        std::
        function<unsigned_long(std::shared_ptr<gmlc::networking::TcpConnection>,char_const*,unsigned_long)>
        ::function<helics::tcp::TcpCommsSS::queue_tx_function()::__0&,void>
                  ((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                    *)in_stack_ffffffffffffee10,
                   (anon_class_8_1_8991fb9c *)
                   CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
        gmlc::networking::TcpConnection::setDataCall
                  (in_stack_ffffffffffffee20,
                   (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                    *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
        std::
        function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
        ::~function((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                     *)0x408d6b);
        std::
        __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x408d78);
        std::function<bool(std::shared_ptr<gmlc::networking::TcpConnection>,std::error_code_const&)>
        ::function<helics::tcp::TcpCommsSS::queue_tx_function()::__1&,void>
                  ((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                    *)in_stack_ffffffffffffee10,
                   (anon_class_8_1_3fcf6524 *)
                   CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
        gmlc::networking::TcpConnection::setErrorCall
                  (in_stack_ffffffffffffee20,
                   (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                    *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
        std::
        function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
        ~function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                   *)0x408dc1);
        peVar9 = std::
                 __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x408dce);
        gmlc::networking::TcpConnection::send
                  (peVar9,(int)local_240,__buf,(size_t)__n_00._M_node,(int)in_R8);
        std::
        __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x408ded);
        gmlc::networking::TcpConnection::startReceive(in_stack_ffffffffffffee80);
        std::
        vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
        ::emplace_back<std::__cxx11::string_const&,std::shared_ptr<gmlc::networking::TcpConnection>>
                  ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                    *)in_stack_ffffffffffffee10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                   (shared_ptr<gmlc::networking::TcpConnection> *)
                   CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
      }
      std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
                ((shared_ptr<gmlc::networking::TcpConnection> *)0x408ed9);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_298);
    }
  }
  CommsInterface::setRxStatus(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c);
  CLI::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)0x40913e);
  std::shared_ptr<gmlc::networking::TcpConnection>::shared_ptr
            ((shared_ptr<gmlc::networking::TcpConnection> *)0x40914b);
  std::
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::map((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
         *)0x409158);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40916c);
  if (!bVar1) {
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
               SUB41((uint)in_stack_ffffffffffffedfc >> 0x18,0));
  }
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
  if (bVar1) {
    if (*(int *)&in_RDI[0x20]._M_left < 0) {
      uVar3 = getDefaultBrokerPort((TcpCommsSS *)0x4091c4);
      __n_00._M_node = (_Base_ptr)(ulong)uVar3;
      *(uint *)&in_RDI[0x20]._M_left = uVar3;
    }
    if (((ulong)((_Alloc_hider *)&in_RDI[0x26]._M_color)->_M_p & 1) == 0) goto LAB_004097de;
    std::
    __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x40921f);
    gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x409227);
    __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&in_RDI[8]._M_left;
    CLI::std::__cxx11::to_string(in_stack_ffffffffffffee4c);
    local_438 = *(undefined8 *)(in_RDI + 0x13);
    in_R8 = local_430;
    timeOut.__r._4_4_ = in_stack_ffffffffffffefac;
    timeOut.__r._0_4_ = in_stack_ffffffffffffefa8;
    gmlc::networking::establishConnection
              (in_stack_ffffffffffffefa0,
               (io_context *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
               in_stack_ffffffffffffef90,
               (string *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),timeOut);
    std::shared_ptr<gmlc::networking::TcpConnection>::operator=
              ((shared_ptr<gmlc::networking::TcpConnection> *)
               CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
               (shared_ptr<gmlc::networking::TcpConnection> *)
               CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
    std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
              ((shared_ptr<gmlc::networking::TcpConnection> *)0x4092d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_3d0);
    if (bVar1) {
      std::
      __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4093d5);
      std::
      function<unsigned_long(std::shared_ptr<gmlc::networking::TcpConnection>,char_const*,unsigned_long)>
      ::function<helics::tcp::TcpCommsSS::queue_tx_function()::__0&,void>
                ((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                  *)in_stack_ffffffffffffee10,
                 (anon_class_8_1_8991fb9c *)
                 CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
      gmlc::networking::TcpConnection::setDataCall
                (in_stack_ffffffffffffee20,
                 (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                  *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
      std::
      function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
      ::~function((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                   *)0x40941e);
      std::
      __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x40942b);
      std::function<bool(std::shared_ptr<gmlc::networking::TcpConnection>,std::error_code_const&)>::
      function<helics::tcp::TcpCommsSS::queue_tx_function()::__1&,void>
                ((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                  *)in_stack_ffffffffffffee10,
                 (anon_class_8_1_3fcf6524 *)
                 CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
      gmlc::networking::TcpConnection::setErrorCall
                (in_stack_ffffffffffffee20,
                 (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                  *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
      std::
      function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
      ~function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                 *)0x409474);
      peVar9 = std::
               __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x409481);
      gmlc::networking::TcpConnection::send(peVar9,(int)local_240,__buf_00,(size_t)__n,(int)in_R8);
      std::
      __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4094a0);
      gmlc::networking::TcpConnection::startReceive(in_stack_ffffffffffffee80);
      gmlc::networking::makePortAddress
                ((string *)in_stack_ffffffffffffee38,in_stack_ffffffffffffee34);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                             *)CONCAT26(in_stack_ffffffffffffee46,
                                        CONCAT15(in_stack_ffffffffffffee45,in_stack_ffffffffffffee40
                                                )),(key_type *)in_stack_ffffffffffffee38);
      __n_00._M_node = (_Rb_tree_node_base *)0x0;
      pmVar7->rid = 0;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
      goto LAB_004097de;
    }
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee10,
               (char *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
    message_01._M_str = (char *)in_stack_ffffffffffffee80;
    message_01._M_len = (size_t)in_stack_ffffffffffffee78;
    iVar12 = local_448;
    CommsInterface::logError(in_stack_ffffffffffffee70,message_01);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_40);
    if (bVar1) {
      peVar10 = std::
                __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x409345);
      gmlc::networking::TcpServer::close(peVar10,iVar12);
    }
    CommsInterface::setTxStatus(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c);
    CommsInterface::setRxStatus(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c);
    local_104 = 1;
  }
  else {
LAB_004097de:
    CommsInterface::setTxStatus(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c);
    dataFunc = (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18);
    local_549 = 0;
    while (((local_549 ^ 0xff) & 1) != 0) {
      route_id::route_id(&local_550);
      ActionMessage::ActionMessage((ActionMessage *)in_stack_ffffffffffffee10);
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::pop((BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
             *)CONCAT17(in_stack_ffffffffffffefef,in_stack_ffffffffffffefe8));
      std::tie<helics::route_id,helics::ActionMessage>
                ((route_id *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                 (ActionMessage *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
      std::tuple<helics::route_id&,helics::ActionMessage&>::operator=
                ((tuple<helics::route_id_&,_helics::ActionMessage_&> *)in_stack_ffffffffffffee10,
                 (pair<helics::route_id,_helics::ActionMessage> *)
                 CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
      std::pair<helics::route_id,_helics::ActionMessage>::~pair
                ((pair<helics::route_id,_helics::ActionMessage> *)0x409880);
      local_6d9 = 0;
      bVar1 = isProtocolCommand((ActionMessage *)
                                CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
      if (bVar1) {
        local_6e0 = 0xffffffff;
        bVar1 = route_id::operator==(&local_550,(route_id)0xffffffff);
        if (!bVar1) goto LAB_0040ab9e;
        local_6d9 = 1;
        if (local_608.messageID == 0xe9) {
          local_779 = 0;
          local_788 = local_258;
          local_790._M_current =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                  ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
          local_798 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>
                       *)std::
                         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                         ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
          while( true ) {
            bVar1 = __gnu_cxx::
                    operator==<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>_>
                              ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                               (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            local_7a0 = __gnu_cxx::
                        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>_>
                        ::operator*(&local_790);
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_7a0->second);
            if (bVar1) {
              sVar13 = SmallBuffer::to_string((SmallBuffer *)0x409d32);
              local_7b0 = sVar13;
              local_7c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00
                                                ));
              __x_01._M_str._0_4_ = in_stack_ffffffffffffee30;
              __x_01._M_len = (size_t)in_stack_ffffffffffffee28;
              __x_01._M_str._4_4_ = in_stack_ffffffffffffee34;
              __y_01._M_str = (char *)in_stack_ffffffffffffee20;
              __y_01._M_len = (size_t)dataFunc;
              __n_00._M_node = (_Base_ptr)local_7c0._M_str;
              bVar1 = std::operator==(__x_01,__y_01);
              if (bVar1) {
                iVar4 = ActionMessage::getExtraData((ActionMessage *)0x409dbc);
                route_id::route_id(&local_7c4,iVar4);
                pVar14 = std::
                         map<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                         ::
                         emplace<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>>
                                   ((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                                     *)in_stack_ffffffffffffee10,
                                    (route_id *)
                                    CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                                    (shared_ptr<gmlc::networking::TcpConnection> *)
                                    CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
                local_7d8 = (_Base_ptr)pVar14.first._M_node;
                in_stack_ffffffffffffefef = pVar14.second;
                local_779 = 1;
                local_7d0 = in_stack_ffffffffffffefef;
                iVar4 = ActionMessage::getExtraData((ActionMessage *)0x409e46);
                route_id::route_id(&local_7dc,iVar4);
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                                       *)CONCAT26(in_stack_ffffffffffffee46,
                                                  CONCAT15(in_stack_ffffffffffffee45,
                                                           in_stack_ffffffffffffee40)),
                                      (key_type *)in_stack_ffffffffffffee38);
                __n_00._M_node = (_Base_ptr)(ulong)(uint)local_7dc.rid;
                pmVar7->rid = local_7dc.rid;
              }
            }
            __gnu_cxx::
            __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>_>
            ::operator++(&local_790);
          }
          if ((local_779 & 1) == 0) {
            sVar13 = SmallBuffer::to_string((SmallBuffer *)0x409ec2);
            local_810 = sVar13._M_str;
            __n_00._M_node = (_Base_ptr)sVar13._M_len;
            local_818 = __n_00._M_node;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT26(in_stack_ffffffffffffee46,
                                CONCAT15(in_stack_ffffffffffffee45,in_stack_ffffffffffffee40)),
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee38
                       ,(allocator<char> *)
                        CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30));
            local_7e8._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                         *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8),
                        (key_type *)0x409f3d);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
            std::allocator<char>::~allocator(&local_819);
            local_828._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                        *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
            bVar1 = std::operator==(&local_7e8,&local_828);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              local_779 = 1;
              ppVar8 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>
                       ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>
                                     *)0x409fbb);
              local_82c._0_3_ = 0;
              local_82c._3_1_ = (__atomic_base<bool>)0x0;
              bVar1 = route_id::operator==(&ppVar8->second,(route_id)0x0);
              if (bVar1) {
                iVar4 = ActionMessage::getExtraData((ActionMessage *)0x409ff1);
                route_id::route_id(&local_830,iVar4);
                pVar14 = std::
                         map<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                         ::
                         emplace<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>&>
                                   ((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                                     *)in_stack_ffffffffffffee10,
                                    (route_id *)
                                    CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                                    (shared_ptr<gmlc::networking::TcpConnection> *)
                                    CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
                __n_00 = pVar14.first._M_node;
                local_838 = pVar14.second;
                local_840 = __n_00._M_node;
              }
              else {
                iVar4 = ActionMessage::getExtraData((ActionMessage *)0x40a0bd);
                route_id::route_id(&local_844,iVar4);
                std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>
                              *)0x40a0e7);
                std::
                map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                ::operator[]((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                              *)CONCAT26(in_stack_ffffffffffffee46,
                                         CONCAT15(in_stack_ffffffffffffee45,
                                                  in_stack_ffffffffffffee40)),
                             (key_type *)in_stack_ffffffffffffee38);
                pVar14 = std::
                         map<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                         ::
                         emplace<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>&>
                                   ((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                                     *)in_stack_ffffffffffffee10,
                                    (route_id *)
                                    CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                                    (shared_ptr<gmlc::networking::TcpConnection> *)
                                    CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
                __n_00 = pVar14.first._M_node;
                local_850 = pVar14.second;
                local_858 = __n_00._M_node;
              }
            }
          }
          if ((local_779 & 1) == 0) {
            if (((ulong)((_Alloc_hider *)&in_RDI[0x26]._M_color)->_M_p & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT26(in_stack_ffffffffffffee46,
                                  CONCAT15(in_stack_ffffffffffffee45,in_stack_ffffffffffffee40)),
                         (char *)in_stack_ffffffffffffee38,
                         (allocator<char> *)
                         CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30));
              sVar13 = SmallBuffer::to_string((SmallBuffer *)0x40a921);
              local_aa0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar13._M_str;
              __n_00._M_node = (_Base_ptr)sVar13._M_len;
              local_aa9._1_8_ = __n_00._M_node;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT26(in_stack_ffffffffffffee46,
                                  CONCAT15(in_stack_ffffffffffffee45,in_stack_ffffffffffffee40)),
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_ffffffffffffee38,
                         (allocator<char> *)
                         CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffee38,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30));
              local_a30 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00
                                                ));
              message_03._M_str = (char *)in_stack_ffffffffffffee80;
              message_03._M_len = (size_t)in_stack_ffffffffffffee78;
              CommsInterface::logWarning(in_stack_ffffffffffffee70,message_03);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
              std::allocator<char>::~allocator(local_aa9);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
              std::allocator<char>::~allocator(local_a71);
            }
            else {
              std::
              __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x40a185);
              gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x40a18d);
              sVar13 = SmallBuffer::to_string((SmallBuffer *)0x40a1a4);
              local_898 = sVar13;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT26(in_stack_ffffffffffffee46,
                                  CONCAT15(in_stack_ffffffffffffee45,in_stack_ffffffffffffee40)),
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_ffffffffffffee38,
                         (allocator<char> *)
                         CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30));
              local_8ac = 0;
              std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                        ((duration<long,std::ratio<1l,1000l>> *)&local_8a8,&local_8ac);
              __n_00._M_node = &local_888;
              in_R8 = local_8a8;
              gmlc::networking::establishConnection
                        (in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                         in_stack_ffffffffffffeed0,in_stack_ffffffffffffeee8);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
              std::allocator<char>::~allocator(&local_899);
              bVar1 = std::__shared_ptr::operator_cast_to_bool(local_868);
              if (bVar1) {
                std::
                __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x40a298);
                std::
                function<unsigned_long(std::shared_ptr<gmlc::networking::TcpConnection>,char_const*,unsigned_long)>
                ::function<helics::tcp::TcpCommsSS::queue_tx_function()::__0&,void>
                          ((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                            *)in_stack_ffffffffffffee10,
                           (anon_class_8_1_8991fb9c *)
                           CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
                gmlc::networking::TcpConnection::setDataCall(in_stack_ffffffffffffee20,dataFunc);
                std::
                function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                ::~function((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                             *)0x40a2e1);
                std::
                __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x40a2ee);
                std::
                function<bool(std::shared_ptr<gmlc::networking::TcpConnection>,std::error_code_const&)>
                ::function<helics::tcp::TcpCommsSS::queue_tx_function()::__1&,void>
                          ((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                            *)in_stack_ffffffffffffee10,
                           (anon_class_8_1_3fcf6524 *)
                           CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
                gmlc::networking::TcpConnection::setErrorCall
                          (in_stack_ffffffffffffee20,
                           (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                            *)dataFunc);
                std::
                function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                ::~function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                             *)0x40a337);
                peVar9 = std::
                         __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x40a344);
                gmlc::networking::TcpConnection::send
                          (peVar9,(int)local_240,__buf_01,(size_t)__n_00._M_node,(int)in_R8);
                std::
                __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x40a363);
                gmlc::networking::TcpConnection::startReceive(in_stack_ffffffffffffee80);
                iVar4 = ActionMessage::getExtraData((ActionMessage *)0x40a37a);
                route_id::route_id(local_8f4,iVar4);
                pVar14 = std::
                         map<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                         ::
                         emplace<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>>
                                   ((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                                     *)in_stack_ffffffffffffee10,
                                    (route_id *)
                                    CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                                    (shared_ptr<gmlc::networking::TcpConnection> *)
                                    CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
                local_90c._4_8_ = pVar14.first._M_node;
                local_90c[3].rid._0_1_ = pVar14.second;
                iVar4 = ActionMessage::getExtraData((ActionMessage *)0x40a3f8);
                route_id::route_id(local_90c,iVar4);
                sVar13 = SmallBuffer::to_string((SmallBuffer *)0x40a422);
                local_940 = sVar13;
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT26(in_stack_ffffffffffffee46,
                                    CONCAT15(in_stack_ffffffffffffee45,in_stack_ffffffffffffee40)),
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_ffffffffffffee38,
                           (allocator<char> *)
                           CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30));
                in_stack_ffffffffffffeee8.__r =
                     (rep)std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                                        *)CONCAT26(in_stack_ffffffffffffee46,
                                                   CONCAT15(in_stack_ffffffffffffee45,
                                                            in_stack_ffffffffffffee40)),
                                       (key_type *)in_stack_ffffffffffffee38);
                __n_00._M_node = (_Base_ptr)(ulong)(uint)local_90c[0].rid;
                ((mapped_type *)in_stack_ffffffffffffeee8.__r)->rid = local_90c[0].rid;
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
                std::allocator<char>::~allocator(&local_941);
              }
              std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
                        ((shared_ptr<gmlc::networking::TcpConnection> *)0x40a5eb);
            }
          }
          goto LAB_0040ab9e;
        }
        if (local_608.messageID == 0xf4) {
          iVar4 = ActionMessage::getExtraData((ActionMessage *)0x40aaf1);
          route_id::route_id(&local_ab0,iVar4);
          std::
          map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
          ::erase((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                  (key_type *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
          local_6d9 = 1;
          goto LAB_0040ab9e;
        }
        if (local_608.messageID == 299) {
          bVar1 = std::__shared_ptr::operator_cast_to_bool(local_40);
          if (!bVar1) goto LAB_0040ab9e;
          std::
          __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x409976);
          ActionMessage::getExtraData((ActionMessage *)0x40998b);
          gmlc::networking::TcpServer::findSocket
                    (in_stack_ffffffffffffee78,(int)((ulong)in_stack_ffffffffffffee70 >> 0x20));
          bVar1 = std::__shared_ptr::operator_cast_to_bool(local_6f0);
          if (bVar1) {
            bVar1 = std::__shared_ptr::operator_cast_to_bool(local_3d0);
            if (bVar1) {
LAB_00409bb9:
              bVar1 = std::__shared_ptr::operator_cast_to_bool(local_6f0);
              if (bVar1) {
                sVar13 = SmallBuffer::to_string((SmallBuffer *)0x409bd9);
                local_760 = sVar13._M_str;
                __n_00._M_node = (_Base_ptr)sVar13._M_len;
                local_768 = __n_00._M_node;
                std::
                vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                ::
                emplace_back<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<gmlc::networking::TcpConnection>>
                          ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                            *)in_stack_ffffffffffffee10,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                           (shared_ptr<gmlc::networking::TcpConnection> *)
                           CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
              }
              goto LAB_00409c63;
            }
            local_751 = 0;
            sVar13 = SmallBuffer::to_string((SmallBuffer *)0x4099f2);
            local_700 = sVar13;
            local_710 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00))
            ;
            __x._M_str._0_4_ = in_stack_ffffffffffffee30;
            __x._M_len = (size_t)in_stack_ffffffffffffee28;
            __x._M_str._4_4_ = in_stack_ffffffffffffee34;
            __y._M_str = (char *)in_stack_ffffffffffffee20;
            __y._M_len = (size_t)dataFunc;
            pcVar11 = local_710._M_str;
            bVar1 = std::operator==(__x,__y);
            __n_00._M_node = (_Base_ptr)CONCAT71((int7)((ulong)pcVar11 >> 8),bVar1);
            local_fc1 = true;
            if (!bVar1) {
              sVar13 = SmallBuffer::to_string((SmallBuffer *)0x409a8e);
              local_720 = sVar13;
              gmlc::networking::makePortAddress
                        ((string *)in_stack_ffffffffffffee38,in_stack_ffffffffffffee34);
              local_751 = 1;
              local_730 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00
                                                ));
              __x_00._M_str._0_4_ = in_stack_ffffffffffffee30;
              __x_00._M_len = (size_t)in_stack_ffffffffffffee28;
              __x_00._M_str._4_4_ = in_stack_ffffffffffffee34;
              __y_00._M_str = (char *)in_stack_ffffffffffffee20;
              __y_00._M_len = (size_t)dataFunc;
              __n_00._M_node = (_Base_ptr)local_730._M_str;
              local_fc1 = std::operator==(__x_00,__y_00);
            }
            if ((local_751 & 1) != 0) {
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
            }
            if (local_fc1 == false) goto LAB_00409bb9;
            std::shared_ptr<gmlc::networking::TcpConnection>::operator=
                      ((shared_ptr<gmlc::networking::TcpConnection> *)
                       CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                       (shared_ptr<gmlc::networking::TcpConnection> *)
                       CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
            local_104 = 8;
          }
          else {
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee10
                       ,(char *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
            message_02._M_str = (char *)in_stack_ffffffffffffee80;
            message_02._M_len = (size_t)in_stack_ffffffffffffee78;
            CommsInterface::logWarning(in_stack_ffffffffffffee70,message_02);
LAB_00409c63:
            local_104 = 0;
          }
          std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
                    ((shared_ptr<gmlc::networking::TcpConnection> *)0x409c7b);
          goto LAB_0040ab9e;
        }
        if (local_608.messageID != 0x9db) {
          if (local_608.messageID == 0x16570bf) {
            CommsInterface::setRxStatus(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c);
          }
          else {
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee10
                       ,(char *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
            message_04._M_str = (char *)in_stack_ffffffffffffee80;
            message_04._M_len = (size_t)in_stack_ffffffffffffee78;
            CommsInterface::logWarning(in_stack_ffffffffffffee70,message_04);
          }
          goto LAB_0040ab9e;
        }
        local_549 = 1;
        local_104 = 6;
      }
      else {
LAB_0040ab9e:
        if ((local_6d9 & 1) == 0) {
          local_ae8._36_4_ = 0;
          bVar1 = route_id::operator==(&local_550,(route_id)0x0);
          if (bVar1) {
            bVar1 = std::atomic::operator_cast_to_bool
                              ((atomic<bool> *)
                               CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
            if (bVar1) {
              bVar1 = std::__shared_ptr::operator_cast_to_bool(local_3d0);
              if (bVar1) {
                peVar9 = std::
                         __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x40ac22);
                ActionMessage::packetize_abi_cxx11_(in_stack_ffffffffffffee28);
                gmlc::networking::TcpConnection::send
                          (peVar9,(int)local_ae8,__buf_02,(size_t)__n_00._M_node,(int)in_R8);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
                goto LAB_0040b8ed;
              }
            }
            in_stack_ffffffffffffee70 = (CommsInterface *)local_be9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT26(in_stack_ffffffffffffee46,
                                CONCAT15(in_stack_ffffffffffffee45,in_stack_ffffffffffffee40)),
                       (char *)in_stack_ffffffffffffee38,
                       (allocator<char> *)
                       CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30));
            ActionMessage::action(&local_608);
            actionMessageType((action_t)((ulong)in_stack_ffffffffffffee10 >> 0x20));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                           (char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
            local_be9._65_16_ =
                 (undefined1  [16])
                 std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
            message_05._M_str = (char *)in_stack_ffffffffffffee80;
            message_05._M_len = (size_t)in_stack_ffffffffffffee78;
            CommsInterface::logWarning(in_stack_ffffffffffffee70,message_05);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
            std::allocator<char>::~allocator((allocator<char> *)local_be9);
          }
          else {
            local_bf8._M_node =
                 (_Base_ptr)
                 std::
                 map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                 ::find((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8),
                        (key_type *)0x40b07a);
            local_c00._M_node =
                 (_Base_ptr)
                 std::
                 map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                 ::end((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
            bVar1 = std::operator==(&local_bf8,&local_c00);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              bVar1 = std::atomic::operator_cast_to_bool
                                ((atomic<bool> *)
                                 CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
              if (bVar1) {
                in_stack_ffffffffffffee38 =
                     std::
                     __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x40b43a);
                ActionMessage::packetize_abi_cxx11_(in_stack_ffffffffffffee28);
                gmlc::networking::TcpConnection::send
                          (in_stack_ffffffffffffee38,(int)local_d10,__buf_04,(size_t)__n_00._M_node,
                           (int)in_R8);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
              }
              else {
                bVar1 = isDisconnectCommand((ActionMessage *)
                                            CONCAT44(in_stack_ffffffffffffee0c,
                                                     in_stack_ffffffffffffee08));
                if (!bVar1) {
                  dataFunc = local_e31;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT26(in_stack_ffffffffffffee46,
                                      CONCAT15(in_stack_ffffffffffffee45,in_stack_ffffffffffffee40))
                             ,(char *)in_stack_ffffffffffffee38,
                             (allocator<char> *)
                             CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30));
                  prettyPrintString_abi_cxx11_((ActionMessage *)in_stack_fffffffffffff0c0);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffee38,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30));
                  local_df0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_ffffffffffffee04,
                                                     in_stack_ffffffffffffee00));
                  message_06._M_str = (char *)in_stack_ffffffffffffee80;
                  message_06._M_len = (size_t)in_stack_ffffffffffffee78;
                  CommsInterface::logWarning(in_stack_ffffffffffffee70,message_06);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
                  std::allocator<char>::~allocator((allocator<char> *)local_e31);
                }
              }
            }
            else {
              std::
              _Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
                            *)0x40b0d0);
              peVar9 = std::
                       __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x40b0dc);
              ActionMessage::packetize_abi_cxx11_(in_stack_ffffffffffffee28);
              gmlc::networking::TcpConnection::send
                        (peVar9,(int)local_c20,__buf_03,(size_t)__n_00._M_node,(int)in_R8);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
            }
          }
LAB_0040b8ed:
          local_104 = 0;
        }
        else {
          local_104 = 6;
        }
      }
      ActionMessage::~ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
    }
    local_e60.__align = (long)local_258;
    local_e68._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
    local_e70 = std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
    while( true ) {
      iVar12 = (int)&local_e70;
      bVar1 = __gnu_cxx::
              operator==<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>_>
                        ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                         (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_e90._24_8_ =
           __gnu_cxx::
           __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>_>
           ::operator*(&local_e68);
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)&((reference)local_e90._24_8_)->second);
      if (bVar1) {
        peVar9 = std::
                 __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x40b9c2);
        gmlc::networking::TcpConnection::close(peVar9,iVar12);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>_>
      ::operator++(&local_e68);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
    ::clear((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
             *)0x40b9ec);
    local_e90._16_8_ = local_400;
    local_e90._8_8_ =
         std::
         map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
         ::begin((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
    local_e90._0_8_ =
         std::
         map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
         ::end((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
    while( true ) {
      __y_02 = (_Self *)local_e90;
      bVar1 = std::operator==((_Self *)(local_e90 + 8),__y_02);
      iVar12 = (int)__y_02;
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_ea8._16_8_ =
           std::
           _Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
           ::operator*((_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
                        *)0x40ba50);
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)&((reference)local_ea8._16_8_)->second);
      if (bVar1) {
        peVar9 = std::
                 __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x40ba80);
        gmlc::networking::TcpConnection::close(peVar9,iVar12);
      }
      std::
      _Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
                    *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_3d0);
    if (bVar1) {
      peVar9 = std::
               __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x40babd);
      gmlc::networking::TcpConnection::close(peVar9,iVar12);
    }
    std::
    map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
    ::clear((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
             *)0x40bad6);
    in_stack_ffffffffffffee10 = (CommsInterface *)local_ea8;
    std::shared_ptr<gmlc::networking::TcpConnection>::shared_ptr
              ((shared_ptr<gmlc::networking::TcpConnection> *)
               CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
               (nullptr_t)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
    std::shared_ptr<gmlc::networking::TcpConnection>::operator=
              ((shared_ptr<gmlc::networking::TcpConnection> *)
               CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
               (shared_ptr<gmlc::networking::TcpConnection> *)
               CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
    std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
              ((shared_ptr<gmlc::networking::TcpConnection> *)0x40bb08);
    CommsInterface::setTxStatus(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_40);
    if (bVar1) {
      local_eb4 = 0x32;
      __rep = &local_eb4;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_eb0,__rep);
      iVar12 = (int)__rep;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT26(in_stack_ffffffffffffee46,
                          CONCAT15(in_stack_ffffffffffffee45,in_stack_ffffffffffffee40)));
      peVar10 = std::
                __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x40bb6d);
      gmlc::networking::TcpServer::close(peVar10,iVar12);
      std::shared_ptr<gmlc::networking::TcpServer>::shared_ptr
                ((shared_ptr<gmlc::networking::TcpServer> *)
                 CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                 (nullptr_t)CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
      std::shared_ptr<gmlc::networking::TcpServer>::operator=
                ((shared_ptr<gmlc::networking::TcpServer> *)
                 CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                 (shared_ptr<gmlc::networking::TcpServer> *)
                 CONCAT44(in_stack_ffffffffffffedfc,in_stack_ffffffffffffedf8));
      std::shared_ptr<gmlc::networking::TcpServer>::~shared_ptr
                ((shared_ptr<gmlc::networking::TcpServer> *)0x40bbaa);
    }
    CVar5 = CommsInterface::getRxStatus((CommsInterface *)0x40bbb7);
    if (CVar5 == CONNECTED) {
      CommsInterface::setRxStatus(in_stack_ffffffffffffee10,CONNECTED);
    }
    local_104 = 0;
  }
  std::
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::~map((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
          *)0x40bbf4);
  std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
            ((shared_ptr<gmlc::networking::TcpConnection> *)0x40bc01);
  CLI::std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffee10);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
          *)0x40bc1b);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
             *)in_stack_ffffffffffffee10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
  ActionMessage::~ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
LAB_0040bc42:
  std::
  unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
  ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                 *)in_stack_ffffffffffffee10);
  gmlc::networking::SocketFactory::~SocketFactory((SocketFactory *)0x40bc5c);
  std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x40bc69);
  std::shared_ptr<gmlc::networking::TcpServer>::~shared_ptr
            ((shared_ptr<gmlc::networking::TcpServer> *)0x40bc76);
  return;
}

Assistant:

void TcpCommsSS::queue_tx_function()
{
    if (serverMode && (PortNumber < 0)) {
        PortNumber = getDefaultBrokerPort();
    }
    if (!serverMode && !outgoingConnectionsAllowed) {
        logError("no server and no outgoing connections-> no way to connect to comms");
        setRxStatus(ConnectionStatus::ERRORED);
        setTxStatus(ConnectionStatus::ERRORED);
        return;
    }
    gmlc::networking::TcpServer::pointer server;
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                          gmlc::networking::SocketFactory();
    auto contextLoop = ioctx->startContextLoop();
    auto dataCall =
        [this](const TcpConnection::pointer& connection, const char* data, size_t datasize) {
            return dataReceive(connection.get(), data, datasize);
        };
    CommsInterface* ci = this;
    auto errorCall = [ci](const TcpConnection::pointer& connection, const std::error_code& error) {
        return commErrorHandler(ci, connection.get(), error);
    };

    if (serverMode) {
        server = gmlc::networking::TcpServer::create(sf,
                                                     ioctx->getBaseContext(),
                                                     localTargetAddress,
                                                     static_cast<uint16_t>(PortNumber.load()),
                                                     true,
                                                     maxMessageSize);
        while (!server->isReady()) {
            logWarning("retrying tcp bind");
            std::this_thread::sleep_for(std::chrono::milliseconds(150));
            auto connected = server->reConnect(connectionTimeout);
            if (!connected) {
                logError("unable to bind to tcp connection socket");
                server->close();
                setRxStatus(ConnectionStatus::ERRORED);
                setTxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
        server->setDataCall(dataCall);
        server->setErrorCall(errorCall);
        server->start();
    }

    // generate a local protocol connection string
    ActionMessage cmessage(CMD_PROTOCOL);
    cmessage.messageID = CONNECTION_INFORMATION;
    cmessage.payload = getAddress();
    auto cstring = cmessage.packetize();

    std::vector<std::pair<std::string, TcpConnection::pointer>> made_connections;
    std::map<std::string, route_id> established_routes;
    if (outgoingConnectionsAllowed) {
        for (const auto& conn : connections) {
            try {
                auto new_connect =
                    gmlc::networking::establishConnection(sf, ioctx->getBaseContext(), conn);

                if (new_connect) {
                    new_connect->setDataCall(dataCall);
                    new_connect->setErrorCall(errorCall);
                    new_connect->send(cstring);
                    new_connect->startReceive();

                    made_connections.emplace_back(conn, std::move(new_connect));
                }
            }
            catch (const std::exception& e) {
                logWarning(std::string("unable to establish connection with ") + conn +
                           "::" + e.what());
            }
        }
    }
    setRxStatus(ConnectionStatus::CONNECTED);
    std::vector<char> buffer;

    TcpConnection::pointer brokerConnection;

    std::map<route_id, TcpConnection::pointer> routes;  // for all the other possible routes
    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    if (hasBroker) {
        if (brokerPort < 0) {
            brokerPort = getDefaultBrokerPort();
        }
        if (outgoingConnectionsAllowed) {
            try {
                brokerConnection = gmlc::networking::establishConnection(sf,
                                                                         ioctx->getBaseContext(),
                                                                         brokerTargetAddress,
                                                                         std::to_string(brokerPort),
                                                                         std::chrono::milliseconds(
                                                                             connectionTimeout));
                if (!brokerConnection) {
                    logError("initial connection to broker timed out");

                    if (server) {
                        server->close();
                    }
                    setTxStatus(ConnectionStatus::ERRORED);
                    setRxStatus(ConnectionStatus::ERRORED);
                    return;
                }

                brokerConnection->setDataCall(dataCall);
                brokerConnection->setErrorCall(errorCall);

                brokerConnection->send(cstring);
                brokerConnection->startReceive();
            }
            catch (std::exception& e) {
                logError(std::string("unable to establish connection with ") + brokerTargetAddress +
                         "::" + e.what());
                setTxStatus(ConnectionStatus::ERRORED);
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
            established_routes[gmlc::networking::makePortAddress(brokerTargetAddress, brokerPort)] =
                parent_route_id;
        }
    }

    setTxStatus(ConnectionStatus::CONNECTED);

    bool haltLoop{false};
    //  std::vector<ActionMessage> txlist;
    while (!haltLoop) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (rid == control_route) {
                processed = true;
                switch (cmd.messageID) {
                    case CONNECTION_INFORMATION:
                        if (server) {
                            auto conn = server->findSocket(cmd.getExtraData());
                            if (conn) {
                                if (!brokerConnection) {  // check if the connection matches the
                                                          // broker
                                    if ((cmd.payload.to_string() == brokerName) ||
                                        (cmd.payload.to_string() ==
                                         gmlc::networking::makePortAddress(brokerTargetAddress,
                                                                           brokerPort))) {
                                        brokerConnection = std::move(conn);
                                        break;
                                    }
                                }
                                if (conn) {
                                    made_connections.emplace_back(cmd.payload.to_string(),
                                                                  std::move(conn));
                                }
                            } else {
                                logWarning("(tcpss) unable to locate socket");
                            }
                        }
                        break;
                    case NEW_ROUTE: {
                        bool established = false;

                        for (auto& mc : made_connections) {
                            if ((mc.second) && (cmd.payload.to_string() == mc.first)) {
                                routes.emplace(route_id{cmd.getExtraData()}, std::move(mc.second));
                                established = true;
                                established_routes[mc.first] = route_id{cmd.getExtraData()};
                            }
                        }
                        if (!established) {
                            auto efind =
                                established_routes.find(std::string(cmd.payload.to_string()));
                            if (efind != established_routes.end()) {
                                established = true;
                                if (efind->second == parent_route_id) {
                                    routes.emplace(route_id{cmd.getExtraData()}, brokerConnection);
                                } else {
                                    routes.emplace(route_id{cmd.getExtraData()},
                                                   routes[efind->second]);
                                }
                            }
                        }

                        if (!established) {
                            if (outgoingConnectionsAllowed) {
                                try {
                                    auto new_connect = gmlc::networking::establishConnection(
                                        sf,
                                        ioctx->getBaseContext(),
                                        std::string(cmd.payload.to_string()));
                                    if (new_connect) {
                                        new_connect->setDataCall(dataCall);
                                        new_connect->setErrorCall(errorCall);
                                        new_connect->send(cstring);
                                        new_connect->startReceive();
                                        routes.emplace(route_id{cmd.getExtraData()},
                                                       std::move(new_connect));
                                        established_routes[std::string(cmd.payload.to_string())] =
                                            route_id{cmd.getExtraData()};
                                    }
                                }
                                catch (const std::exception& e) {
                                    logWarning(std::string("unable to establish connection with ") +
                                               std::string(cmd.payload.to_string()) +
                                               "::" + e.what());
                                }
                            } else {
                                logWarning(std::string("outgoing connections not allowed ") +
                                           std::string(cmd.payload.to_string()));
                            }
                        }
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case CLOSE_RECEIVER:
                        setRxStatus(ConnectionStatus::TERMINATED);
                        break;
                    case DISCONNECT:
                        haltLoop = true;
                        continue;
                    default:
                        logWarning("unrecognized control command");
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }

        if (rid == parent_route_id) {
            if ((hasBroker) && (brokerConnection)) {
                try {
                    brokerConnection->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("broker send 0 ") +
                                     actionMessageType(cmd.action()) + ':' + se.what());
                        }
                    }
                }
            } else {
                logWarning(
                    std::string("(tcpss) no route to broker for message, message dropped :") +
                    actionMessageType(cmd.action()));
            }
        } else {
            //  txlist.push_back(cmd);
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                try {
                    rt_find->second->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("rt send ") + std::to_string(rid.baseValue()) +
                                     "::" + se.what());
                        }
                    }
                }
            } else {
                if (hasBroker) {
                    try {
                        brokerConnection->send(cmd.packetize());
                    }
                    catch (const std::system_error& se) {
                        if (se.code() != asio::error::connection_aborted) {
                            if (!isDisconnectCommand(cmd)) {
                                logError(std::string("broker send ") +
                                         std::to_string(rid.baseValue()) + " ::" + se.what());
                            }
                        }
                    }
                } else {
                    if (!isDisconnectCommand(cmd)) {
                        logWarning(
                            std::string("(tcpss) unknown message destination message dropped ") +
                            prettyPrintString(cmd));
                    }
                }
            }
        }
    }  // while (!haltLoop)

    for (auto& rt : made_connections) {
        if (rt.second) {
            rt.second->close();
        }
    }
    made_connections.clear();
    for (auto& rt : routes) {
        if (rt.second) {
            rt.second->close();
        }
    }
    if (brokerConnection) {
        brokerConnection->close();
    }
    routes.clear();
    brokerConnection = nullptr;
    setTxStatus(ConnectionStatus::TERMINATED);
    if (server) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        server->close();
        server = nullptr;
    }
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        setRxStatus(ConnectionStatus::TERMINATED);
    }
}